

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

int arkInterpEvaluate_Hermite
              (ARKodeMem_conflict ark_mem,ARKInterp interp,sunrealtype tau,int d,int order,
              N_Vector yout)

{
  uint uVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  N_Vector p_Var9;
  undefined8 uVar10;
  char *msgfmt;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  double dVar37;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  double dStack_118;
  double dStack_110;
  double dStack_108;
  double local_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  sunrealtype local_d8;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double local_88;
  double local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  N_Vector local_60;
  N_Vector p_Stack_58;
  N_Vector local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  uVar11 = 0;
  if (0 < order) {
    uVar11 = order;
  }
  uVar1 = *interp->content;
  if ((int)uVar1 <= (int)uVar11) {
    uVar11 = uVar1;
  }
  dVar23 = *(double *)((long)interp->content + 0x38);
  uVar10 = 0;
  if (ark_mem->fn_is_current == 0) {
    uStack_f0 = 0;
    local_f8 = dVar23;
    local_d8 = tau;
    iVar8 = (*ark_mem->step_fullrhs)(ark_mem,ark_mem->tn,ark_mem->yn,ark_mem->fn,1);
    if (iVar8 != 0) {
      return -8;
    }
    ark_mem->fn_is_current = 1;
    dVar23 = local_f8;
    uVar10 = uStack_f0;
    tau = local_d8;
  }
  if (d < 0) {
    msgfmt = "Requested illegal derivative.";
    iVar8 = 0x1e0;
LAB_0013898f:
    arkProcessError(ark_mem,-0x16,iVar8,"arkInterpEvaluate_Hermite",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_interp.c"
                    ,msgfmt);
    return -0x16;
  }
  if ((int)uVar11 < d) {
    N_VConst(0,yout);
    goto LAB_001390e9;
  }
  if (5 < uVar11) {
    msgfmt = "Illegal polynomial order";
    iVar8 = 0x307;
    goto LAB_0013898f;
  }
  dVar34 = tau * tau;
  dVar35 = dVar34 * tau;
  auVar36._0_8_ = dVar23 * dVar23;
  dVar37 = dVar23 * auVar36._0_8_;
  switch(uVar11) {
  case 0:
    uVar10 = *(undefined8 *)((long)interp->content + 0x10);
    p_Var9 = ark_mem->yn;
    dVar34 = 0.5;
    dVar23 = 0.5;
    goto LAB_00138f45;
  case 1:
    if (d == 0) {
      dVar34 = -tau;
      dVar23 = tau + 1.0;
    }
    else {
      dVar34 = -1.0 / dVar23;
      dVar23 = 1.0 / dVar23;
    }
    uVar10 = *(undefined8 *)((long)interp->content + 0x10);
    p_Var9 = ark_mem->yn;
LAB_00138f45:
    N_VLinearSum(dVar34,dVar23,uVar10,p_Var9,yout);
    goto LAB_001390e9;
  case 2:
    if (d == 1) {
      auVar12._0_8_ = tau * 2.0;
      auVar12._8_8_ = tau * -2.0;
      auVar6._8_8_ = dVar23;
      auVar6._0_8_ = dVar23;
      local_128 = divpd(auVar12,auVar6);
      dStack_118 = tau + tau + 1.0;
    }
    else if (d == 0) {
      local_128._8_8_ = 1.0 - dVar34;
      local_128._0_8_ = dVar34;
      dStack_118 = (tau + dVar34) * dVar23;
    }
    else {
      auVar4._8_8_ = dVar23;
      auVar4._0_8_ = dVar23;
      auVar36 = divpd(_DAT_00173440,auVar4);
      dStack_118 = auVar36._0_8_;
      auVar5._8_8_ = dVar23;
      auVar5._0_8_ = dVar23;
      local_128 = divpd(auVar36,auVar5);
    }
    local_68 = *(undefined8 *)((long)interp->content + 0x10);
    local_60 = ark_mem->yn;
    p_Stack_58 = ark_mem->fn;
    uStack_130 = 3;
    break;
  case 3:
    if (d == 2) {
      dVar34 = tau + tau + 1.0;
      auVar14._0_8_ = dVar34 * 6.0;
      auVar14._8_8_ = dVar34 * -6.0;
      auVar36._8_8_ = auVar36._0_8_;
      local_128 = divpd(auVar14,auVar36);
      dStack_118 = (tau * 6.0 + 2.0) / dVar23;
      dStack_110 = (tau * 6.0 + 4.0) / dVar23;
    }
    else if (d == 1) {
      auVar13._0_8_ = (dVar34 + tau) * 6.0;
      auVar13._8_8_ = (dVar34 + tau) * -6.0;
      auVar3._8_8_ = dVar23;
      auVar3._0_8_ = dVar23;
      local_128 = divpd(auVar13,auVar3);
      dStack_118 = tau + tau + dVar34 * 3.0;
      dStack_110 = dVar34 * 3.0 + tau * 4.0 + 1.0;
    }
    else if (d == 0) {
      local_128._8_8_ = dVar35 * -2.0 + dVar34 * -3.0 + 1.0;
      local_128._0_8_ = dVar34 * 3.0 + dVar35 + dVar35;
      dStack_110 = (dVar34 + dVar34 + tau + dVar35) * dVar23;
      dStack_118 = (dVar34 + dVar35) * dVar23;
    }
    else {
      auVar7._8_8_ = dVar37;
      auVar7._0_8_ = dVar37;
      local_128 = divpd(_DAT_00173430,auVar7);
      dStack_110 = 6.0 / auVar36._0_8_;
      dStack_118 = dStack_110;
    }
    local_68 = *(undefined8 *)((long)interp->content + 0x10);
    local_60 = ark_mem->yn;
    p_Stack_58 = *(N_Vector *)((long)interp->content + 8);
    local_50 = ark_mem->fn;
    uStack_130 = 4;
    break;
  case 4:
    local_f8 = dVar23;
    uStack_f0 = uVar10;
    local_e8 = dVar34;
    local_d8 = tau;
    local_c8 = auVar36._0_8_;
    uStack_c0 = uVar10;
    local_b8 = dVar37;
    uStack_b0 = uVar10;
    local_a8 = dVar23 * dVar37;
    uStack_a0 = uVar10;
    local_98 = dVar35 * tau;
    local_88 = dVar35;
    iVar8 = (*interp->ops->evaluate)(ark_mem,interp,-0.3333333333333333,0,3,yout);
    if (iVar8 != 0) {
      return -8;
    }
    iVar8 = (*ark_mem->step_fullrhs)
                      (ark_mem,local_f8 / -3.0 + *(double *)((long)interp->content + 0x30),yout,
                       *(N_Vector *)((long)interp->content + 0x18),2);
    if (iVar8 != 0) {
      return -8;
    }
    switch(d) {
    case 0:
      local_128._8_8_ = local_98 * 9.0 + local_88 * 16.0 + local_e8 * 6.0 + 1.0;
      local_128._0_8_ = local_98 * -9.0 + local_e8 * -6.0 + local_88 * -16.0;
      dStack_118 = (local_98 * -9.0 + local_e8 * -5.0 + local_88 * -14.0) * local_f8 * 0.25;
      dStack_110 = local_f8 * (local_e8 + local_e8 + local_d8 + local_88);
      dStack_108 = ((local_88 * -2.0 - local_98) - local_e8) * local_f8 * 27.0 * 0.25;
      break;
    case 1:
      auVar19._0_8_ = local_88 * -36.0 + local_d8 * -12.0 + -(local_e8 * 48.0);
      auVar19._8_8_ = local_88 * 36.0 + local_d8 * 12.0 + local_e8 * 48.0;
      auVar28._8_8_ = local_f8;
      auVar28._0_8_ = local_f8;
      local_128 = divpd(auVar19,auVar28);
      dStack_118 = (local_88 * -18.0 + local_d8 * -5.0 + local_e8 * -21.0) * 0.5;
      dStack_110 = local_d8 * 4.0 + 1.0 + local_e8 * 3.0;
      dStack_108 = (local_88 + local_88 + local_e8 * 3.0 + local_d8) * -13.5;
      break;
    case 2:
      auVar24._0_8_ = local_e8 * -108.0 + local_d8 * -96.0 + -12.0;
      auVar24._8_8_ = local_e8 * 108.0 + local_d8 * 96.0 + 12.0;
      auVar15._8_8_ = local_c8;
      auVar15._0_8_ = local_c8;
      local_128 = divpd(auVar24,auVar15);
      auVar25._0_8_ = local_e8 * -27.0 + local_d8 * -21.0 + -2.5;
      auVar25._8_8_ = local_d8 * 6.0 + 4.0;
      auVar16._8_8_ = local_f8;
      auVar16._0_8_ = local_f8;
      auVar36 = divpd(auVar25,auVar16);
      dStack_118 = auVar36._0_8_;
      dStack_110 = auVar36._8_8_;
      dStack_108 = (local_e8 * -81.0 + local_d8 * -81.0 + -13.5) / local_f8;
      break;
    case 3:
      auVar17._0_8_ = local_d8 * -216.0 + -96.0;
      auVar17._8_8_ = local_d8 * 216.0 + 96.0;
      auVar26._8_8_ = local_b8;
      auVar26._0_8_ = local_b8;
      local_128 = divpd(auVar17,auVar26);
      auVar18._0_8_ = local_d8 * -54.0 + -21.0;
      auVar18._8_8_ = 0x4018000000000000;
      auVar27._8_8_ = local_c8;
      auVar27._0_8_ = local_c8;
      auVar36 = divpd(auVar18,auVar27);
      dStack_118 = auVar36._0_8_;
      dStack_110 = auVar36._8_8_;
      dStack_108 = (local_d8 * -162.0 + -81.0) / local_c8;
      break;
    default:
      auVar29._8_8_ = local_a8;
      auVar29._0_8_ = local_a8;
      local_128 = divpd(_DAT_00173370,auVar29);
      dStack_118 = -54.0 / local_b8;
      dStack_110 = 0.0;
      dStack_108 = -162.0 / local_b8;
    }
    pvVar2 = interp->content;
    local_68 = *(undefined8 *)((long)pvVar2 + 0x10);
    local_60 = ark_mem->yn;
    p_Stack_58 = *(N_Vector *)((long)pvVar2 + 8);
    local_50 = ark_mem->fn;
    local_48 = *(undefined8 *)((long)pvVar2 + 0x18);
    uStack_130 = 5;
    break;
  case 5:
    local_f8 = dVar23;
    uStack_f0 = uVar10;
    local_e8 = dVar34;
    local_d8 = tau;
    local_c8 = auVar36._0_8_;
    uStack_c0 = uVar10;
    local_b8 = dVar37;
    uStack_b0 = uVar10;
    local_a8 = dVar23 * dVar37;
    uStack_a0 = uVar10;
    local_98 = dVar35 * tau;
    local_88 = dVar35;
    iVar8 = (*interp->ops->evaluate)(ark_mem,interp,-0.3333333333333333,0,4,yout);
    if (iVar8 != 0) {
      return -8;
    }
    iVar8 = (*ark_mem->step_fullrhs)
                      (ark_mem,local_f8 / -3.0 + *(double *)((long)interp->content + 0x30),yout,
                       *(N_Vector *)((long)interp->content + 0x18),2);
    if (iVar8 != 0) {
      return -8;
    }
    iVar8 = (*interp->ops->evaluate)(ark_mem,interp,-0.6666666666666666,0,4,yout);
    if (iVar8 != 0) {
      return -8;
    }
    local_78 = local_f8 + local_f8;
    uStack_70 = uStack_f0;
    iVar8 = (*ark_mem->step_fullrhs)
                      (ark_mem,local_78 / -3.0 + *(double *)((long)interp->content + 0x30),yout,
                       *(N_Vector *)((long)interp->content + 0x20),2);
    if (iVar8 != 0) {
      return -8;
    }
    switch(d) {
    case 0:
      dVar23 = local_98 * local_d8;
      local_100 = local_f8 * 0.25;
      local_128._0_8_ = local_e8 * 30.0 + local_88 * 110.0 + dVar23 * 54.0 + local_98 * 135.0;
      dStack_118 = local_100 * (local_e8 * 13.0 + local_88 * 49.0 + dVar23 * 27.0 + local_98 * 63.0)
      ;
      local_128._8_8_ = 1.0 - (double)local_128._0_8_;
      dStack_110 = local_100 *
                   (local_d8 * 4.0 +
                   local_e8 * 26.0 + local_88 * 67.0 + dVar23 * 27.0 + local_98 * 72.0);
      dStack_108 = local_100 *
                   (local_e8 * 27.0 + local_88 * 135.0 + dVar23 * 81.0 + local_98 * 189.0);
      local_100 = (local_e8 * 54.0 + local_88 * 189.0 + dVar23 * 81.0 + local_98 * 216.0) *
                  local_100;
      break;
    case 1:
      local_128._0_8_ =
           (local_d8 * 60.0 + local_e8 * 330.0 + local_98 * 270.0 + local_88 * 540.0) / local_f8;
      local_128._8_8_ = -(double)local_128._0_8_;
      dStack_118 = (local_d8 * 26.0 + local_e8 * 147.0 + local_88 * 252.0 + local_98 * 135.0) * 0.25
      ;
      dStack_110 = (local_d8 * 52.0 + local_e8 * 201.0 + local_88 * 288.0 + local_98 * 135.0 + 4.0)
                   * 0.25;
      dStack_108 = (local_d8 * 54.0 + local_e8 * 405.0 + local_88 * 756.0 + local_98 * 405.0) * 0.25
      ;
      local_100 = (local_d8 * 108.0 + local_e8 * 567.0 + local_88 * 864.0 + local_98 * 405.0) * 0.25
      ;
      break;
    case 2:
      local_128._0_8_ = (local_d8 * 660.0 + local_88 * 1080.0 + local_e8 * 1620.0 + 60.0) / local_c8
      ;
      local_128._8_8_ = -(double)local_128._0_8_;
      auVar21._0_8_ = local_d8 * 147.0 + local_88 * 270.0 + local_e8 * 378.0 + 13.0;
      auVar21._8_8_ = local_d8 * 201.0 + local_88 * 270.0 + local_e8 * 432.0 + 26.0;
      auVar31._8_8_ = local_78;
      auVar31._0_8_ = local_78;
      auVar36 = divpd(auVar21,auVar31);
      dStack_118 = auVar36._0_8_;
      dStack_110 = auVar36._8_8_;
      dStack_108 = (local_d8 * 405.0 + local_e8 * 1134.0 + local_88 * 810.0 + 27.0) / local_78;
      local_100 = local_d8 * 567.0 + local_e8 * 1296.0 + local_88 * 810.0 + 54.0;
      dVar23 = local_78;
      goto LAB_00139602;
    case 3:
      local_128._0_8_ = (local_e8 * 3240.0 + local_d8 * 3240.0 + 660.0) / local_b8;
      local_128._8_8_ = -(double)local_128._0_8_;
      dVar23 = local_c8 + local_c8;
      auVar22._0_8_ = local_e8 * 810.0 + local_d8 * 756.0 + 147.0;
      auVar22._8_8_ = local_e8 * 810.0 + local_d8 * 864.0 + 201.0;
      auVar32._8_8_ = dVar23;
      auVar32._0_8_ = dVar23;
      auVar36 = divpd(auVar22,auVar32);
      dStack_118 = auVar36._0_8_;
      dStack_110 = auVar36._8_8_;
      dStack_108 = (local_d8 * 2268.0 + local_e8 * 2430.0 + 405.0) / dVar23;
      local_100 = local_d8 * 2592.0 + local_e8 * 2430.0 + 567.0;
LAB_00139602:
      local_100 = local_100 / dVar23;
      break;
    case 4:
      local_128._0_8_ = (local_d8 * 6480.0 + 3240.0) / local_a8;
      local_128._8_8_ = -(double)local_128._0_8_;
      auVar20._0_8_ = local_d8 * 810.0 + 378.0;
      auVar20._8_8_ = local_d8 * 810.0 + 432.0;
      auVar30._8_8_ = local_b8;
      auVar30._0_8_ = local_b8;
      auVar36 = divpd(auVar20,auVar30);
      dStack_118 = auVar36._0_8_;
      dStack_110 = auVar36._8_8_;
      dStack_108 = (local_d8 * 2430.0 + 1134.0) / local_b8;
      local_100 = (local_d8 * 2430.0 + 1296.0) / local_b8;
      break;
    default:
      local_128._0_8_ = 6480.0 / (local_f8 * local_a8);
      auVar33._8_8_ = local_a8;
      auVar33._0_8_ = local_a8;
      auVar36 = divpd(_DAT_00173360,auVar33);
      dStack_118 = auVar36._0_8_;
      local_128._8_8_ = -(double)local_128._0_8_;
      dStack_108 = auVar36._8_8_;
      local_100 = dStack_108;
      dStack_110 = dStack_118;
    }
    pvVar2 = interp->content;
    local_68 = *(undefined8 *)((long)pvVar2 + 0x10);
    local_60 = ark_mem->yn;
    p_Stack_58 = *(N_Vector *)((long)pvVar2 + 8);
    local_50 = ark_mem->fn;
    local_48 = *(undefined8 *)((long)pvVar2 + 0x18);
    local_40 = *(undefined8 *)((long)pvVar2 + 0x20);
    uStack_130 = 6;
  }
  iVar8 = N_VLinearCombination(uStack_130,local_128,&local_68,yout);
  if (iVar8 == 0) {
LAB_001390e9:
    iVar8 = 0;
  }
  else {
    iVar8 = -0x1c;
  }
  return iVar8;
}

Assistant:

int arkInterpEvaluate_Hermite(ARKodeMem ark_mem, ARKInterp interp,
                              sunrealtype tau, int d, int order, N_Vector yout)
{
  /* local variables */
  int q, retval;
  sunrealtype tval, a0, a1, tau2, tau3, tau4, tau5;
  sunrealtype h, h2, h3, h4, h5;
  sunrealtype a[6];
  N_Vector X[6];

  /* set constants */
  tau2 = tau * tau;
  tau3 = tau * tau2;
  tau4 = tau * tau3;
  tau5 = tau * tau4;

  h  = HINT_H(interp);
  h2 = h * h;
  h3 = h * h2;
  h4 = h * h3;
  h5 = h * h4;

  /* determine polynomial order q */
  q = SUNMAX(order, 0);               /* respect lower bound  */
  q = SUNMIN(q, HINT_DEGREE(interp)); /* respect max possible */

  SUNLogDebug(ARK_LOGGER, "interp-eval",
              "tau = " SUN_FORMAT_G ", d = %i, q = %i", tau, d, q);

  /* call full RHS if needed -- called just AFTER the end of a step, so yn has
     been updated to ycur */
  if (!(ark_mem->fn_is_current))
  {
    retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tn, ark_mem->yn,
                                   ark_mem->fn, ARK_FULLRHS_END);
    if (retval) { return ARK_RHSFUNC_FAIL; }
    ark_mem->fn_is_current = SUNTRUE;
  }

  /* error on illegal d */
  if (d < 0)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Requested illegal derivative.");
    return (ARK_ILL_INPUT);
  }

  /* if d is too high, just return zeros */
  if (d > q)
  {
    N_VConst(ZERO, yout);
    return (ARK_SUCCESS);
  }

  /* build polynomial based on order */
  switch (q)
  {
  case (0): /* constant interpolant, yout = 0.5*(yn+yp) */
    N_VLinearSum(HALF, HINT_YOLD(interp), HALF, ark_mem->yn, yout);
    break;

  case (1): /* linear interpolant */
    if (d == 0)
    {
      a0 = -tau;
      a1 = ONE + tau;
    }
    else
    { /* d=1 */
      a0 = -ONE / h;
      a1 = ONE / h;
    }
    N_VLinearSum(a0, HINT_YOLD(interp), a1, ark_mem->yn, yout);
    break;

  case (2): /* quadratic interpolant */
    if (d == 0)
    {
      a[0] = tau2;
      a[1] = ONE - tau2;
      a[2] = h * (tau2 + tau);
    }
    else if (d == 1)
    {
      a[0] = TWO * tau / h;
      a[1] = -TWO * tau / h;
      a[2] = (ONE + TWO * tau);
    }
    else
    { /* d == 2 */
      a[0] = TWO / h / h;
      a[1] = -TWO / h / h;
      a[2] = TWO / h;
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = ark_mem->fn;
    retval = N_VLinearCombination(3, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  case (3): /* cubic interpolant */
    if (d == 0)
    {
      a[0] = THREE * tau2 + TWO * tau3;
      a[1] = ONE - THREE * tau2 - TWO * tau3;
      a[2] = h * (tau2 + tau3);
      a[3] = h * (tau + TWO * tau2 + tau3);
    }
    else if (d == 1)
    {
      a[0] = SIX * (tau + tau2) / h;
      a[1] = -SIX * (tau + tau2) / h;
      a[2] = TWO * tau + THREE * tau2;
      a[3] = ONE + FOUR * tau + THREE * tau2;
    }
    else if (d == 2)
    {
      a[0] = SIX * (ONE + TWO * tau) / h2;
      a[1] = -SIX * (ONE + TWO * tau) / h2;
      a[2] = (TWO + SIX * tau) / h;
      a[3] = (FOUR + SIX * tau) / h;
    }
    else
    { /* d == 3 */
      a[0] = TWELVE / h3;
      a[1] = -TWELVE / h3;
      a[2] = SIX / h2;
      a[3] = SIX / h2;
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = HINT_FOLD(interp);
    X[3]   = ark_mem->fn;
    retval = N_VLinearCombination(4, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  case (4): /* quartic interpolant */

    /* first, evaluate cubic interpolant at tau=-1/3 */
    tval   = -ONE / THREE;
    retval = arkInterpEvaluate(ark_mem, interp, tval, 0, 3, yout);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* second, evaluate RHS at tau=-1/3, storing the result in fa */
    tval   = HINT_TNEW(interp) - h / THREE;
    retval = ark_mem->step_fullrhs(ark_mem, tval, yout, HINT_FA(interp),
                                   ARK_FULLRHS_OTHER);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* evaluate desired function */
    if (d == 0)
    {
      a[0] = -SIX * tau2 - SUN_RCONST(16.0) * tau3 - SUN_RCONST(9.0) * tau4;
      a[1] = ONE + SIX * tau2 + SUN_RCONST(16.0) * tau3 + SUN_RCONST(9.0) * tau4;
      a[2] = h * FOURTH *
             (-FIVE * tau2 - SUN_RCONST(14.0) * tau3 - SUN_RCONST(9.0) * tau4);
      a[3] = h * (tau + TWO * tau2 + tau3);
      a[4] = h * SUN_RCONST(27.0) * FOURTH * (-tau4 - TWO * tau3 - tau2);
    }
    else if (d == 1)
    {
      a[0] =
        (-TWELVE * tau - SUN_RCONST(48.0) * tau2 - SUN_RCONST(36.0) * tau3) / h;
      a[1] = (TWELVE * tau + SUN_RCONST(48.0) * tau2 + SUN_RCONST(36.0) * tau3) /
             h;
      a[2] = HALF *
             (-FIVE * tau - SUN_RCONST(21.0) * tau2 - SUN_RCONST(18.0) * tau3);
      a[3] = (ONE + FOUR * tau + THREE * tau2);
      a[4] = -SUN_RCONST(27.0) * HALF * (TWO * tau3 + THREE * tau2 + tau);
    }
    else if (d == 2)
    {
      a[0] = (-TWELVE - SUN_RCONST(96.0) * tau - SUN_RCONST(108.0) * tau2) / h2;
      a[1] = (TWELVE + SUN_RCONST(96.0) * tau + SUN_RCONST(108.0) * tau2) / h2;
      a[2] = (-FIVE * HALF - SUN_RCONST(21.0) * tau - SUN_RCONST(27.0) * tau2) /
             h;
      a[3] = (FOUR + SIX * tau) / h;
      a[4] = (-SUN_RCONST(27.0) * HALF - SUN_RCONST(81.0) * tau -
              SUN_RCONST(81.0) * tau2) /
             h;
    }
    else if (d == 3)
    {
      a[0] = (-SUN_RCONST(96.0) - SUN_RCONST(216.0) * tau) / h3;
      a[1] = (SUN_RCONST(96.0) + SUN_RCONST(216.0) * tau) / h3;
      a[2] = (-SUN_RCONST(21.0) - SUN_RCONST(54.0) * tau) / h2;
      a[3] = SIX / h2;
      a[4] = (-SUN_RCONST(81.0) - SUN_RCONST(162.0) * tau) / h2;
    }
    else
    { /* d == 4 */
      a[0] = -SUN_RCONST(216.0) / h4;
      a[1] = SUN_RCONST(216.0) / h4;
      a[2] = -SUN_RCONST(54.0) / h3;
      a[3] = ZERO;
      a[4] = -SUN_RCONST(162.0) / h3;
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = HINT_FOLD(interp);
    X[3]   = ark_mem->fn;
    X[4]   = HINT_FA(interp);
    retval = N_VLinearCombination(5, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  case (5): /* quintic interpolant */

    /* first, evaluate quartic interpolant at tau=-1/3 */
    tval   = -ONE / THREE;
    retval = arkInterpEvaluate(ark_mem, interp, tval, 0, 4, yout);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* second, evaluate RHS at tau=-1/3, storing the result in fa */
    tval   = HINT_TNEW(interp) - h / THREE;
    retval = ark_mem->step_fullrhs(ark_mem, tval, yout, HINT_FA(interp),
                                   ARK_FULLRHS_OTHER);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* third, evaluate quartic interpolant at tau=-2/3 */
    tval   = -TWO / THREE;
    retval = arkInterpEvaluate(ark_mem, interp, tval, 0, 4, yout);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* fourth, evaluate RHS at tau=-2/3, storing the result in fb */
    tval   = HINT_TNEW(interp) - h * TWO / THREE;
    retval = ark_mem->step_fullrhs(ark_mem, tval, yout, HINT_FB(interp),
                                   ARK_FULLRHS_OTHER);
    if (retval != 0) { return (ARK_RHSFUNC_FAIL); }

    /* evaluate desired function */
    if (d == 0)
    {
      a[0] = SUN_RCONST(54.0) * tau5 + SUN_RCONST(135.0) * tau4 +
             SUN_RCONST(110.0) * tau3 + SUN_RCONST(30.0) * tau2;
      a[1] = ONE - a[0];
      a[2] = h / FOUR *
             (SUN_RCONST(27.0) * tau5 + SUN_RCONST(63.0) * tau4 +
              SUN_RCONST(49.0) * tau3 + SUN_RCONST(13.0) * tau2);
      a[3] = h / FOUR *
             (SUN_RCONST(27.0) * tau5 + SUN_RCONST(72.0) * tau4 +
              SUN_RCONST(67.0) * tau3 + SUN_RCONST(26.0) * tau2 + FOUR * tau);
      a[4] = h / FOUR *
             (SUN_RCONST(81.0) * tau5 + SUN_RCONST(189.0) * tau4 +
              SUN_RCONST(135.0) * tau3 + SUN_RCONST(27.0) * tau2);
      a[5] = h / FOUR *
             (SUN_RCONST(81.0) * tau5 + SUN_RCONST(216.0) * tau4 +
              SUN_RCONST(189.0) * tau3 + SUN_RCONST(54.0) * tau2);
    }
    else if (d == 1)
    {
      a[0] = (SUN_RCONST(270.0) * tau4 + SUN_RCONST(540.0) * tau3 +
              SUN_RCONST(330.0) * tau2 + SUN_RCONST(60.0) * tau) /
             h;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(135.0) * tau4 + SUN_RCONST(252.0) * tau3 +
              SUN_RCONST(147.0) * tau2 + SUN_RCONST(26.0) * tau) /
             FOUR;
      a[3] = (SUN_RCONST(135.0) * tau4 + SUN_RCONST(288.0) * tau3 +
              SUN_RCONST(201.0) * tau2 + SUN_RCONST(52.0) * tau + FOUR) /
             FOUR;
      a[4] = (SUN_RCONST(405.0) * tau4 + SUN_RCONST(4.0) * 189 * tau3 +
              SUN_RCONST(405.0) * tau2 + SUN_RCONST(54.0) * tau) /
             FOUR;
      a[5] = (SUN_RCONST(405.0) * tau4 + SUN_RCONST(864.0) * tau3 +
              SUN_RCONST(567.0) * tau2 + SUN_RCONST(108.0) * tau) /
             FOUR;
    }
    else if (d == 2)
    {
      a[0] = (SUN_RCONST(1080.0) * tau3 + SUN_RCONST(1620.0) * tau2 +
              SUN_RCONST(660.0) * tau + SUN_RCONST(60.0)) /
             h2;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(270.0) * tau3 + SUN_RCONST(378.0) * tau2 +
              SUN_RCONST(147.0) * tau + SUN_RCONST(13.0)) /
             (TWO * h);
      a[3] = (SUN_RCONST(270.0) * tau3 + SUN_RCONST(432.0) * tau2 +
              SUN_RCONST(201.0) * tau + SUN_RCONST(26.0)) /
             (TWO * h);
      a[4] = (SUN_RCONST(810.0) * tau3 + SUN_RCONST(1134.0) * tau2 +
              SUN_RCONST(405.0) * tau + SUN_RCONST(27.0)) /
             (TWO * h);
      a[5] = (SUN_RCONST(810.0) * tau3 + SUN_RCONST(1296.0) * tau2 +
              SUN_RCONST(567.0) * tau + SUN_RCONST(54.0)) /
             (TWO * h);
    }
    else if (d == 3)
    {
      a[0] = (SUN_RCONST(3240.0) * tau2 + SUN_RCONST(3240.0) * tau +
              SUN_RCONST(660.0)) /
             h3;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(810.0) * tau2 + SUN_RCONST(756.0) * tau +
              SUN_RCONST(147.0)) /
             (TWO * h2);
      a[3] = (SUN_RCONST(810.0) * tau2 + SUN_RCONST(864.0) * tau +
              SUN_RCONST(201.0)) /
             (TWO * h2);
      a[4] = (SUN_RCONST(2430.0) * tau2 + SUN_RCONST(2268.0) * tau +
              SUN_RCONST(405.0)) /
             (TWO * h2);
      a[5] = (SUN_RCONST(2430.0) * tau2 + SUN_RCONST(2592.0) * tau +
              SUN_RCONST(567.0)) /
             (TWO * h2);
    }
    else if (d == 4)
    {
      a[0] = (SUN_RCONST(6480.0) * tau + SUN_RCONST(3240.0)) / h4;
      a[1] = -a[0];
      a[2] = (SUN_RCONST(810.0) * tau + SUN_RCONST(378.0)) / h3;
      a[3] = (SUN_RCONST(810.0) * tau + SUN_RCONST(432.0)) / h3;
      a[4] = (SUN_RCONST(2430.0) * tau + SUN_RCONST(1134.0)) / h3;
      a[5] = (SUN_RCONST(2430.0) * tau + SUN_RCONST(1296.0)) / h3;
    }
    else
    { /* d == 5 */
      a[0] = SUN_RCONST(6480.0) / h5;
      a[1] = -a[0];
      a[2] = SUN_RCONST(810.0) / h4;
      a[3] = a[2];
      a[4] = SUN_RCONST(2430.0) / h4;
      a[5] = a[4];
    }
    X[0]   = HINT_YOLD(interp);
    X[1]   = ark_mem->yn;
    X[2]   = HINT_FOLD(interp);
    X[3]   = ark_mem->fn;
    X[4]   = HINT_FA(interp);
    X[5]   = HINT_FB(interp);
    retval = N_VLinearCombination(6, a, X, yout);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
    break;

  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Illegal polynomial order");
    return (ARK_ILL_INPUT);
  }

  return (ARK_SUCCESS);
}